

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# umutablecptrie.cpp
# Opt level: O2

UMutableCPTrie * umutablecptrie_fromUCPTrie_63(UCPTrie *trie,UErrorCode *pErrorCode)

{
  char cVar1;
  UChar32 end;
  LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie> this;
  uint32_t iniValue;
  uint32_t errValue;
  int start;
  MutableCodePointTrie *p;
  LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> mutableTrie;
  LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie> local_40;
  uint32_t local_34;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return (UMutableCPTrie *)0x0;
  }
  if (trie == (UCPTrie *)0x0) {
LAB_002c9468:
    *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    return (UMutableCPTrie *)0x0;
  }
  cVar1 = trie->valueWidth;
  if (cVar1 == '\x02') {
    errValue = (uint32_t)*(byte *)((long)(trie->data).ptr0 + (long)trie->dataLength + -1);
    iniValue = (uint32_t)*(byte *)((long)(trie->data).ptr0 + (long)trie->dataLength + -2);
  }
  else if (cVar1 == '\x01') {
    iniValue = *(uint32_t *)((long)(trie->data).ptr0 + (long)trie->dataLength * 4 + -8);
    errValue = *(uint32_t *)((long)(trie->data).ptr0 + (long)trie->dataLength * 4 + -4);
  }
  else {
    if (cVar1 != '\0') goto LAB_002c9468;
    errValue = (uint32_t)*(ushort *)((long)(trie->data).ptr0 + (long)trie->dataLength * 2 + -2);
    iniValue = (uint32_t)*(ushort *)((long)(trie->data).ptr0 + (long)trie->dataLength * 2 + -4);
  }
  this.ptr = (MutableCodePointTrie *)
             icu_63::UMemory::operator_new((UMemory *)0x11040,(size_t)pErrorCode);
  if (this.ptr != (MutableCodePointTrie *)0x0) {
    icu_63::anon_unknown_0::MutableCodePointTrie::MutableCodePointTrie
              (this.ptr,iniValue,errValue,pErrorCode);
  }
  local_40.super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr =
       (LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>)
       (LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>)this.ptr;
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR && this.ptr == (MutableCodePointTrie *)0x0) {
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    start = 0;
    if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      while (end = ucptrie_getRange_63(trie,start,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,
                                       (void *)0x0,&local_34), -1 < end) {
        if (local_34 != iniValue) {
          if (start == end) {
            icu_63::anon_unknown_0::MutableCodePointTrie::set(this.ptr,start,local_34,pErrorCode);
          }
          else {
            icu_63::anon_unknown_0::MutableCodePointTrie::setRange
                      (this.ptr,start,end,local_34,pErrorCode);
          }
        }
        start = end + 1;
      }
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        local_40.super_LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>.ptr =
             (LocalPointerBase<icu_63::(anonymous_namespace)::MutableCodePointTrie>)
             (MutableCodePointTrie *)0x0;
        goto LAB_002c955b;
      }
    }
  }
  this.ptr = (MutableCodePointTrie *)0x0;
LAB_002c955b:
  icu_63::LocalPointer<icu_63::(anonymous_namespace)::MutableCodePointTrie>::~LocalPointer
            (&local_40);
  return (UMutableCPTrie *)this.ptr;
}

Assistant:

int32_t getAllSameOverlap(const uint32_t *p, int32_t length, uint32_t value,
                          int32_t blockLength) {
    int32_t min = length - (blockLength - 1);
    int32_t i = length;
    while (min < i && p[i - 1] == value) { --i; }
    return length - i;
}